

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

double mjs::to_number(value *v)

{
  bool bVar1;
  value_type vVar2;
  string *s;
  wostream *os;
  value *local_208;
  wstring local_1f8 [32];
  wstring_view local_1d8;
  wostringstream local_1c8 [8];
  wostringstream _woss;
  value local_40;
  value *local_18;
  value *v_local;
  
  local_18 = v;
  vVar2 = value::type(v);
  switch(vVar2) {
  case undefined:
    v_local = (value *)0x7ff8000000000000;
    break;
  case null:
    v_local = (value *)0x0;
    break;
  case boolean:
    bVar1 = value::boolean_value(local_18);
    local_208 = (value *)0x3ff0000000000000;
    if (!bVar1) {
      local_208 = (value *)0x0;
    }
    v_local = local_208;
    break;
  case number:
    v_local = (value *)value::number_value(local_18);
    break;
  case string:
    s = value::string_value(local_18);
    v_local = (value *)to_number(s);
    break;
  case object:
    to_primitive(&local_40,local_18,number);
    v_local = (value *)to_number(&local_40);
    value::~value(&local_40);
    break;
  case reference:
  default:
    std::__cxx11::wostringstream::wostringstream(local_1c8);
    os = std::operator<<((wostream *)local_1c8,"Not implemented: ");
    vVar2 = value::type(local_18);
    operator<<(os,vVar2);
    std::__cxx11::wostringstream::str();
    local_1d8 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1f8);
    throw_runtime_error(&local_1d8,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0xa4);
  }
  return (double)v_local;
}

Assistant:

double to_number(const value& v) {
    switch (v.type()) {
    case value_type::undefined: return NAN;
    case value_type::null:      return +0.0;
    case value_type::boolean:   return v.boolean_value() ? 1.0 : +0.0;
    case value_type::number:    return v.number_value();
    case value_type::string:    return to_number(v.string_value());
    case value_type::object:    return to_number(to_primitive(v, value_type::number));
    case value_type::reference: break;
    }
    NOT_IMPLEMENTED(v.type());
}